

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_RUBBLE(effect_handler_context_t_conflict *context)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  chunk_conflict *c;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint32_t uVar6;
  loc lVar7;
  wchar_t *pwVar8;
  wchar_t d;
  uint uVar9;
  long lVar10;
  wchar_t wVar11;
  bool bVar12;
  
  wVar4 = Rand_div(3);
  lVar7.x = (player->grid).x;
  lVar7.y = (player->grid).y;
  uVar9 = 0;
  wVar5 = count_neighbors((loc *)0x0,cave,lVar7,square_isempty,false);
  wVar11 = wVar4 + L'\x01';
  if (wVar5 <= wVar4) {
    wVar11 = wVar5;
  }
  if (L'\0' < wVar11) {
    do {
      lVar10 = 0;
      do {
        lVar7 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid_ddd[lVar10]);
        _Var3 = square_in_bounds_fully(cave,lVar7);
        if (((_Var3) && (_Var3 = square_isempty(cave,lVar7), _Var3)) &&
           (uVar6 = Rand_div(3), uVar6 == 0)) {
          uVar6 = Rand_div(2);
          pwVar8 = &FEAT_RUBBLE;
          if (uVar6 == 0) {
            pwVar8 = &FEAT_PASS_RUBBLE;
          }
          square_set_feat(cave,lVar7,*pwVar8);
          c = cave;
          if (cave->depth == 0) {
            _Var3 = is_daytime();
            expose_to_sun((chunk *)c,lVar7,_Var3);
          }
          wVar11 = wVar11 + L'\xffffffff';
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
    } while ((L'\0' < wVar11) && (bVar12 = uVar9 < 9, uVar9 = uVar9 + 1, bVar12));
  }
  context->ident = true;
  ppVar2 = player->upkeep;
  uVar1._0_4_ = ppVar2->update;
  uVar1._4_4_ = ppVar2->redraw;
  ppVar2->update = (int)(uVar1 | 0xc00000000000c0);
  ppVar2->redraw = (int)((uVar1 | 0xc00000000000c0) >> 0x20);
  return true;
}

Assistant:

bool effect_handler_RUBBLE(effect_handler_context_t *context)
{
	/*
	 * First we work out how many grids we want to fill with rubble.  Then we
	 * check that we can actually do this, by counting the number of grids
	 * available, limiting the number of rubble grids to this number if
	 * necessary.
	 */
	int rubble_grids = randint1(3);
	int open_grids = count_neighbors(NULL, cave, player->grid,
		square_isempty, false);

	if (rubble_grids > open_grids) {
		rubble_grids = open_grids;
	}

	/* Avoid infinite loops */
	int iterations = 0;

	while (rubble_grids > 0 && iterations < 10) {
		/* Look around the player */
		for (int d = 0; d < 8; d++) {
			/* Extract adjacent (legal) location */
			struct loc grid = loc_sum(player->grid, ddgrid_ddd[d]);
			if (!square_in_bounds_fully(cave, grid)) continue;
			if (!square_isempty(cave, grid)) continue;

			if (one_in_(3)) {
				if (one_in_(2))
					square_set_feat(cave, grid, FEAT_PASS_RUBBLE);
				else
					square_set_feat(cave, grid, FEAT_RUBBLE);
				if (cave->depth == 0)
					expose_to_sun(cave, grid, is_daytime());
				rubble_grids--;
			}
		}

		iterations++;
	}

	context->ident = true;

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}